

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall UnifiedRegex::CharSet<char16_t>::Sort(CharSet<char16_t> *this)

{
  code *pcVar1;
  bool bVar2;
  uint value;
  uint uVar3;
  undefined4 *puVar4;
  uint j;
  uint index;
  uint index_00;
  uint index_01;
  
  if (4 < (this->rep).compact.countPlusOne - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x372,"(IsCompact())","IsCompact()");
    if (!bVar2) {
LAB_00e6f45d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  index_01 = 1;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00e6f380:
  if (4 < (this->rep).compact.countPlusOne - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x1ef,"(IsCompact())","IsCompact()");
    if (!bVar2) goto LAB_00e6f45d;
    *puVar4 = 0;
  }
  if (*(int *)&this->rep - 1U <= index_01) {
    return;
  }
  value = GetCompactCharU(this,index_01);
  index = 0;
  do {
    uVar3 = GetCompactCharU(this,index);
    index_00 = index_01;
    if (value < uVar3) goto LAB_00e6f40a;
    index = index + 1;
  } while (index_01 != index);
  goto LAB_00e6f446;
LAB_00e6f40a:
  while ((int)index < (int)index_00) {
    uVar3 = GetCompactCharU(this,index_00 - 1);
    ReplaceCompactCharU(this,index_00,uVar3);
    index_00 = index_00 - 1;
  }
  ReplaceCompactCharU(this,index,value);
LAB_00e6f446:
  index_01 = index_01 + 1;
  goto LAB_00e6f380;
}

Assistant:

void CharSet<char16>::Sort()
    {
        Assert(IsCompact());
        __assume(this->GetCompactLength() <= MaxCompact);
        for (uint i = 1; i < this->GetCompactLength(); i++)
        {
            uint curr = GetCompactCharU(i);
            for (uint j = 0; j < i; j++)
            {
                if (GetCompactCharU(j) > curr)
                {
                    for (int k = i; k > (int)j; k--)
                    {
                        this->ReplaceCompactCharU(k, this->GetCompactCharU(k - 1));
                    }
                    this->ReplaceCompactCharU(j, curr);
                    break;
                }
            }
        }
    }